

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-context.c
# Opt level: O0

_Bool cmd_menu(command_list *list,void *selection_p)

{
  _Bool _Var1;
  _Bool _Var2;
  size_t sVar3;
  ui_event uVar4;
  ui_event_type local_130;
  _Bool result;
  cmd_info **selection;
  ui_event evt;
  region_conflict area;
  menu_iter commands_menu;
  menu_conflict menu;
  void *selection_p_local;
  command_list *list_local;
  
  memcpy(&area.width,&DAT_002f3928,0x28);
  evt._4_8_ = 0x400000017;
  area.col = 0x25;
  area.row = 0xd;
  _Var1 = false;
  menu_init((menu_conflict *)&commands_menu.resize,MN_SKIN_SCROLL,(menu_iter *)&area.width);
  menu_setpriv((menu_conflict *)&commands_menu.resize,(int)list->len,list->list);
  evt._8_4_ = evt._8_4_ - list->menu_level;
  evt.key.code = list->menu_level * 2 + evt.key.code;
  if ((int)evt._8_4_ < 2) {
    __assert_fail("area.row > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-context.c"
                  ,0x493,"_Bool cmd_menu(struct command_list *, void *)");
  }
  menu_layout((menu_conflict *)&commands_menu.resize,(region_conflict *)&evt.mouse.x);
  screen_save();
  window_make(evt.key.code + L'\xfffffffe',evt._8_4_ + L'\xffffffff',evt.key.code + L'\'',
              evt._8_4_ + L'\r');
  do {
    while( true ) {
      uVar4 = menu_select((menu_conflict *)&commands_menu.resize,0,true);
      local_130 = CONCAT31(local_130._1_3_,uVar4.key.mods);
      evt.type = local_130;
      selection._4_4_ = uVar4.type;
      if (selection._4_4_ == EVT_SELECT) break;
      if (selection._4_4_ == EVT_ESCAPE) {
        _Var1 = true;
LAB_0022eb85:
        if (((_Var1 == false) || (screen_save_depth < 2)) || ((tile_width < 2 && (tile_height < 2)))
           ) {
          screen_load();
        }
        else {
          screen_load_all();
        }
        return _Var1;
      }
    }
    if ((list->list[(int)menu.row_funcs].cmd != CMD_NULL) ||
       (list->list[(int)menu.row_funcs].hook != (_func_void *)0x0)) {
      *(cmd_info **)selection_p = list->list + (int)menu.row_funcs;
      goto LAB_0022eb85;
    }
    if (list->list[(int)menu.row_funcs].nested_cached_idx == -1) {
      sVar3 = cmd_list_lookup_by_name(list->list[(int)menu.row_funcs].nested_name);
      list->list[(int)menu.row_funcs].nested_cached_idx = (int)sVar3;
    }
    if ((list->list[(int)menu.row_funcs].nested_cached_idx < 0) ||
       (_Var2 = cmd_menu((command_list *)
                         (cmds_all + list->list[(int)menu.row_funcs].nested_cached_idx),selection_p)
       , !_Var2)) goto LAB_0022eb85;
  } while( true );
}

Assistant:

static bool cmd_menu(struct command_list *list, void *selection_p)
{
	struct menu menu;
	menu_iter commands_menu = { NULL, NULL, cmd_sub_entry, NULL, NULL };
	region area = { 23, 4, 37, 13 };

	ui_event evt;
	struct cmd_info **selection = selection_p;
	/*
	 * By default, cause the containing menu to break out of its event
	 * handling when this function returns.
	 */
	bool result = false;

	/* Set up the menu */
	menu_init(&menu, MN_SKIN_SCROLL, &commands_menu);
	menu_setpriv(&menu, list->len, list->list);
	area.col += 2 * list->menu_level;
	area.row -= list->menu_level;
	assert(area.row > 1);
	menu_layout(&menu, &area);

	/* Set up the screen */
	screen_save();
	window_make(area.col - 2, area.row - 1, area.col + 39, area.row + 13);

	while (1) {
		/* Select an entry */
		evt = menu_select(&menu, 0, true);

		if (evt.type == EVT_SELECT) {
			if (list->list[menu.cursor].cmd ||
					list->list[menu.cursor].hook) {
				/* It's a proper command. */
				*selection = &list->list[menu.cursor];
				break;
			} else {
				/*
				 * It's a placeholder that's a parent for a
				 * nested menu.
				 */
				/*
				 * Look up the list of commands for the nested
				 * menu.
				 */
				if (list->list[menu.cursor].nested_cached_idx == -1) {
					list->list[menu.cursor].nested_cached_idx =
						cmd_list_lookup_by_name(list->list[menu.cursor].nested_name);
				}
				if (list->list[menu.cursor].nested_cached_idx >= 0) {
					/* Display a menu for it. */
					if (!cmd_menu(&cmds_all[list->list[menu.cursor].nested_cached_idx], selection_p)) {
						break;
					}
				} else {
					break;
				}
			}
		} else if (evt.type == EVT_ESCAPE) {
			/*
			 * Return to the containing menu and don't break out all
			 * the way to main game loop.
			 */
			result = true;
			break;
		}
	}

	/*
	 * Load the screen.  Do a more expensive update if not breaking out
	 * all the way from the menus and there may be partially overwritten
	 * big tiles.
	 */
	if (result && screen_save_depth > 1
			&& (tile_width > 1 || tile_height > 1)) {
		screen_load_all();
	} else {
		screen_load();
	}

	return result;
}